

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureDecodeEnabledCase::verifyResult
          (TextureDecodeEnabledCase *this)

{
  float fVar1;
  TestLog *pTVar2;
  ulong uVar3;
  int i;
  deUint32 dVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  float fVar8;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<float,_4> res;
  Vec4 pixelReference;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  Vec4 pixelConverted;
  Vector<float,_4> res_1;
  char local_230 [8];
  long *local_228;
  long lStack_220;
  long local_218 [2];
  float local_208 [4];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_1f8;
  float local_1d8 [4];
  pointer local_1c8;
  _func_int **pp_Stack_1c0;
  Vec4 local_1b8;
  undefined1 local_1a8 [8];
  _func_int **pp_Stack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_130 [272];
  
  pTVar2 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (Vec4 *)0x0;
  local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8 = (pointer)0x0;
  pp_Stack_1c0 = (_func_int **)0x0;
  local_208[0] = 0.0;
  local_208[1] = 0.0;
  local_208[2] = 0.0;
  local_208[3] = 0.0;
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels(&this->super_SRGBTestCase,&local_1f8);
  tcu::linearToSRGB((tcu *)local_1a8,
                    local_1f8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1c8 = (pointer)local_1a8;
  pp_Stack_1c0 = pp_Stack_1a0;
  local_1a8 = (undefined1  [8])0x3e99999a3e4ccccd;
  pp_Stack_1a0 = (_func_int **)0x3f8000003ecccccd;
  tcu::linearToSRGB((tcu *)local_1d8,(Vec4 *)local_1a8);
  dVar4 = glu::getInternalFormat((this->super_SRGBTestCase).m_internalFormat);
  if (dVar4 == 0x8fbd) {
    local_1d8[1] = 0.0;
    local_1d8[2] = 0.0;
  }
  local_208[0] = local_1d8[0];
  local_208[1] = (float)local_1d8._4_8_;
  local_208[2] = SUB84(local_1d8._4_8_,4);
  local_208[3] = local_1d8[3];
  dVar4 = glu::getInternalFormat((this->super_SRGBTestCase).m_internalFormat);
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Expected color: ","");
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = 0.0;
  if (dVar4 != 0x8fbd) {
    local_1b8.m_data[2] = 0.4;
    local_1b8.m_data[1] = 0.3;
  }
  local_1b8.m_data[0] = 0.2;
  local_1b8.m_data[3] = 1.0;
  SRGBTestCase::logColor(&this->super_SRGBTestCase,(string *)local_1a8,0,&local_1b8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  local_228 = (long *)0x0;
  lStack_220 = 0;
  lVar5 = 0;
  do {
    *(float *)((long)&local_228 + lVar5 * 4) =
         *(float *)((long)&local_1c8 + lVar5 * 4) - local_208[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_1a8 = (undefined1  [8])0x0;
  pp_Stack_1a0 = (_func_int **)0x0;
  lVar5 = 0;
  do {
    fVar1 = *(float *)((long)&local_228 + lVar5 * 4);
    fVar8 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar8 = fVar1;
    }
    *(float *)(local_1a8 + lVar5 * 4) = fVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_230[4] = '\0';
  local_230[5] = '\0';
  local_230[6] = '\0';
  local_230[7] = '\0';
  lVar5 = 0;
  do {
    fVar1 = (this->super_SRGBTestCase).m_epsilonError.m_data[lVar5];
    local_230[lVar5 + 4] =
         *(float *)(local_1a8 + lVar5 * 4) <= fVar1 && fVar1 != *(float *)(local_1a8 + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_1a8 = (undefined1  [8])pTVar2;
  if (local_230[4] == '\0') {
LAB_014c140a:
    local_230[0] = '\0';
    local_230[1] = '\0';
    local_230[2] = '\0';
    local_230[3] = '\0';
    lVar5 = 0;
    do {
      local_230[lVar5] = *(float *)((long)&local_1c8 + lVar5 * 4) == local_208[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (local_230[0] != '\0') {
      uVar3 = 0;
      do {
        uVar6 = uVar3;
        if (uVar6 == 3) break;
        uVar3 = uVar6 + 1;
      } while (local_230[uVar6 + 1] != '\0');
      if (2 < uVar6) goto LAB_014c145f;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a0);
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"not linear as expected","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a0,(char *)local_228,lStack_220);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a0);
    std::ios_base::~ios_base(local_130);
    bVar7 = false;
  }
  else {
    uVar3 = 0;
    do {
      uVar6 = uVar3;
      if (uVar6 == 3) break;
      uVar3 = uVar6 + 1;
    } while (local_230[uVar6 + 5] != '\0');
    if (uVar6 < 3) goto LAB_014c140a;
LAB_014c145f:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a0);
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"linear as expected","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a0,(char *)local_228,lStack_220);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a0);
    std::ios_base::~ios_base(local_130);
    bVar7 = true;
  }
  if (local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (Vec4 *)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool TextureDecodeEnabledCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelConverted;
	tcu::Vec4				pixelReference;
	tcu::Vec4				pixelExpected;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelConverted = tcu::linearToSRGB(pixelResultList[resultColorIdx]);
	pixelReference = this->formatReferenceColor(getColorReferenceSRGB());
	pixelExpected = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected);

	// result color 0 should be SRGB. Compare with sRGB reference color
	if ( (tcu::boolAll(tcu::lessThan(tcu::abs(pixelConverted - pixelReference), m_epsilonError))) || (tcu::boolAll(tcu::equal(pixelConverted, pixelReference))) )
	{
		log << tcu::TestLog::Message << std::string("linear as expected") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("not linear as expected") << tcu::TestLog::EndMessage;
		return false;
	}
}